

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void TPZFrontNonSym<double>::main(void)

{
  int iVar1;
  double *pdVar2;
  char *pcVar3;
  DecomposeType decType;
  TPZFMatrix<double> Load_2;
  double rnd_1;
  int random_1;
  TPZFMatrix<double> Load;
  ofstream outeqn;
  TPZEqnArray<double> Result;
  ofstream output;
  string OutFile;
  TPZVec<long> DestIndex;
  TPZFrontNonSym<double> TestFront;
  TPZFMatrix<double> Prova;
  double rnd;
  int random;
  TPZFMatrix<double> TestMatrix;
  int matsize;
  int j;
  int i;
  double in_stack_ffffffffffffc528;
  DecomposeType dt;
  TPZEqnArray<double> *in_stack_ffffffffffffc530;
  int64_t in_stack_ffffffffffffc538;
  TPZEqnArray<double> *eqnarray;
  TPZFMatrix<double> *in_stack_ffffffffffffc540;
  TPZFMatrix<double> *in_stack_ffffffffffffc548;
  TPZFMatrix<double> *in_stack_ffffffffffffc550;
  _func_int **in_stack_ffffffffffffc558;
  TPZEqnArray<double> *in_stack_ffffffffffffc560;
  TPZFMatrix<double> *in_stack_ffffffffffffc568;
  TPZFMatrix<double> *in_stack_ffffffffffffc570;
  DecomposeType in_stack_ffffffffffffc5c4;
  TPZFMatrix<double> *in_stack_ffffffffffffc5c8;
  undefined4 in_stack_ffffffffffffc5d0;
  DecomposeType in_stack_ffffffffffffc5d4;
  TPZFMatrix<double> *in_stack_ffffffffffffc5d8;
  TPZEqnArray<double> *in_stack_ffffffffffffc5e0;
  TPZFrontNonSym<double> *in_stack_ffffffffffffc6b0;
  undefined1 local_3948 [500];
  MatrixOutputFormat in_stack_ffffffffffffc8ac;
  ostream *in_stack_ffffffffffffc8b0;
  char *in_stack_ffffffffffffc8b8;
  TPZMatrix<double> *in_stack_ffffffffffffc8c0;
  undefined1 local_4b8 [512];
  undefined1 local_2b8 [532];
  int local_a4;
  int local_c;
  int local_8;
  int local_4;
  
  local_c = 6;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_ffffffffffffc570,(int64_t)in_stack_ffffffffffffc568,
             (int64_t)in_stack_ffffffffffffc560);
  for (local_4 = 0; local_4 < local_c; local_4 = local_4 + 1) {
    for (local_8 = local_4; local_8 < local_c; local_8 = local_8 + 1) {
      local_a4 = rand();
      in_stack_ffffffffffffc570 = (TPZFMatrix<double> *)(double)((local_a4 * local_c) / 0x7fff);
      local_2b8._520_8_ = in_stack_ffffffffffffc570;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                          (int64_t)in_stack_ffffffffffffc540);
      *pdVar2 = (double)in_stack_ffffffffffffc570;
      in_stack_ffffffffffffc568 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                      (int64_t)in_stack_ffffffffffffc540);
      in_stack_ffffffffffffc558 =
           (in_stack_ffffffffffffc568->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable
           ._vptr_TPZSavable;
      in_stack_ffffffffffffc560 =
           (TPZEqnArray<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                      (int64_t)in_stack_ffffffffffffc540);
      *(_func_int ***)in_stack_ffffffffffffc560 = in_stack_ffffffffffffc558;
      if (local_4 == local_8) {
        in_stack_ffffffffffffc550 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                        (int64_t)in_stack_ffffffffffffc540);
        (in_stack_ffffffffffffc550->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable = (_func_int **)0x40b7700000000000;
      }
    }
  }
  TPZFMatrix<double>::TPZFMatrix((TPZFMatrix<double> *)in_stack_ffffffffffffc560);
  TPZFMatrix<double>::operator=(in_stack_ffffffffffffc548,in_stack_ffffffffffffc540);
  TPZMatrix<double>::Print
            (in_stack_ffffffffffffc8c0,in_stack_ffffffffffffc8b8,in_stack_ffffffffffffc8b0,
             in_stack_ffffffffffffc8ac);
  TPZFrontNonSym((TPZFrontNonSym<double> *)in_stack_ffffffffffffc540,in_stack_ffffffffffffc538);
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_ffffffffffffc530,(int64_t)in_stack_ffffffffffffc528)
  ;
  for (local_4 = 0; local_4 < local_c; local_4 = local_4 + 1) {
    in_stack_ffffffffffffc540 = (TPZFMatrix<double> *)(long)local_4;
    in_stack_ffffffffffffc548 =
         (TPZFMatrix<double> *)
         TPZVec<long>::operator[]
                   ((TPZVec<long> *)(local_2b8 + 0x20),(int64_t)in_stack_ffffffffffffc540);
    (in_stack_ffffffffffffc548->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)in_stack_ffffffffffffc540;
  }
  SymbolicAddKel((TPZFrontNonSym<double> *)in_stack_ffffffffffffc550,
                 (TPZVec<long> *)in_stack_ffffffffffffc548);
  SymbolicDecomposeEquations
            ((TPZFrontNonSym<double> *)in_stack_ffffffffffffc540,in_stack_ffffffffffffc538,
             (int64_t)in_stack_ffffffffffffc530);
  eqnarray = (TPZEqnArray<double> *)local_2b8;
  std::__cxx11::string::string((string *)eqnarray);
  std::__cxx11::string::operator=((string *)eqnarray,"TPZFrontNonSymTest.txt");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_4b8,pcVar3,_S_app);
  Compress(in_stack_ffffffffffffc6b0);
  AllocData((TPZFrontNonSym<double> *)in_stack_ffffffffffffc540);
  AddKel((TPZFrontNonSym<double> *)in_stack_ffffffffffffc570,in_stack_ffffffffffffc568,
         (TPZVec<long> *)in_stack_ffffffffffffc560);
  TPZEqnArray<double>::TPZEqnArray(in_stack_ffffffffffffc560);
  DecomposeEquations((TPZFrontNonSym<double> *)in_stack_ffffffffffffc550,
                     (int64_t)in_stack_ffffffffffffc548,(int64_t)in_stack_ffffffffffffc540,eqnarray)
  ;
  std::ofstream::ofstream(local_3948,"TestEQNArray.txt",_S_app);
  TPZEqnArray<double>::Print
            (in_stack_ffffffffffffc560,(char *)in_stack_ffffffffffffc558,
             (ostream *)in_stack_ffffffffffffc550);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_ffffffffffffc570,(int64_t)in_stack_ffffffffffffc568,
             (int64_t)in_stack_ffffffffffffc560);
  for (local_4 = 0; dt = (DecomposeType)((ulong)in_stack_ffffffffffffc528 >> 0x20),
      local_4 < local_c; local_4 = local_4 + 1) {
    iVar1 = rand();
    in_stack_ffffffffffffc528 = (double)((iVar1 * local_c) / 0x7fff);
    in_stack_ffffffffffffc530 =
         (TPZEqnArray<double> *)
         TPZFMatrix<double>::operator()
                   (in_stack_ffffffffffffc550,(int64_t)in_stack_ffffffffffffc548,
                    (int64_t)in_stack_ffffffffffffc540);
    *(double *)in_stack_ffffffffffffc530 = in_stack_ffffffffffffc528;
  }
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_ffffffffffffc570,(int64_t)in_stack_ffffffffffffc568,
             (int64_t)in_stack_ffffffffffffc560);
  TPZFMatrix<double>::operator=(in_stack_ffffffffffffc548,in_stack_ffffffffffffc540);
  TPZMatrix<double>::SolveDirect
            ((TPZMatrix<double> *)eqnarray,(TPZFMatrix<double> *)in_stack_ffffffffffffc530,dt);
  TPZMatrix<double>::Print
            (in_stack_ffffffffffffc8c0,in_stack_ffffffffffffc8b8,in_stack_ffffffffffffc8b0,
             in_stack_ffffffffffffc8ac);
  TPZEqnArray<double>::EqnForward
            (in_stack_ffffffffffffc5e0,in_stack_ffffffffffffc5d8,in_stack_ffffffffffffc5d4);
  TPZEqnArray<double>::EqnBackward
            ((TPZEqnArray<double> *)CONCAT44(in_stack_ffffffffffffc5d4,in_stack_ffffffffffffc5d0),
             in_stack_ffffffffffffc5c8,in_stack_ffffffffffffc5c4);
  TPZMatrix<double>::Print
            (in_stack_ffffffffffffc8c0,in_stack_ffffffffffffc8b8,in_stack_ffffffffffffc8b0,
             in_stack_ffffffffffffc8ac);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1d182e8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1d182f5);
  std::ofstream::~ofstream(local_3948);
  TPZEqnArray<double>::~TPZEqnArray(in_stack_ffffffffffffc530);
  std::ofstream::~ofstream(local_4b8);
  std::__cxx11::string::~string((string *)local_2b8);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_ffffffffffffc530);
  ~TPZFrontNonSym((TPZFrontNonSym<double> *)0x1d18343);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1d18350);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1d1835d);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::main()
{
	int i, j;
	/**
	 * 	Populates data structure
	 */
	int matsize=6;
	TPZFMatrix<TVar> TestMatrix(matsize,matsize);
	for(i=0;i<matsize;i++) {
		for(j=i;j<matsize;j++) {
			int random = rand();
			double rnd = (random*matsize)/0x7fff;
			TestMatrix(i,j)=rnd;
			TestMatrix(j,i)=TestMatrix(i,j);
			if(i==j) TestMatrix(i,j)=6000.;
		}
	}
	
	TPZFMatrix<TVar> Prova;
	Prova=TestMatrix;
	
	//	Prova.Decompose_Cholesky();
	Prova.Print("TPZFMatrix<TVar> Cholesky");
	
	TPZFrontNonSym TestFront(matsize);
	
	
	TPZVec<int64_t> DestIndex(matsize);
	for(i=0;i<matsize;i++) DestIndex[i]=i;
	
	TestFront.SymbolicAddKel(DestIndex);
	TestFront.SymbolicDecomposeEquations(0,matsize-1); 
	
	std::string OutFile;
	OutFile = "TPZFrontNonSymTest.txt";
	
	ofstream output(OutFile.c_str(),ios::app);
	
	TestFront.Compress();
	
	TestFront.AllocData();
	
	TestFront.AddKel(TestMatrix, DestIndex);
	TPZEqnArray<TVar> Result;

	TestFront.DecomposeEquations(0,matsize-1,Result);
	ofstream outeqn("TestEQNArray.txt",ios::app);
	
	Result.Print("TestEQNArray.txt",outeqn);
	
	
	TPZFMatrix<TVar> Load(matsize);
	
	for(i=0;i<matsize;i++) {
		int random = rand();
		double rnd = (random*matsize)/0x7fff;
		Load(i,0)=rnd;
	}
	
	TPZFMatrix<TVar> Load_2(matsize);
	Load_2=Load;
	
	DecomposeType decType = ECholesky;
	Prova.SolveDirect(Load, decType);
	
	Load.Print("Load");
	//TestFront.Print(OutFile, output);
	
	Result.EqnForward(Load_2, decType);
	Result.EqnBackward(Load_2, decType);
	
	Load_2.Print("Eqn");
}